

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

int Abc_NodeCompareLevels(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = *(uint *)&(*pp1)->field_0x14 >> 0xc;
  uVar4 = *(uint *)&(*pp2)->field_0x14 >> 0xc;
  uVar3 = 0xffffffff;
  if ((uVar4 <= uVar5) && (uVar3 = 1, uVar5 == uVar4)) {
    iVar1 = (*pp2)->Id;
    uVar3 = 0xffffffff;
    iVar2 = (*pp1)->Id;
    if (iVar1 <= iVar2) {
      uVar3 = (uint)(iVar2 != iVar1);
    }
  }
  return uVar3;
}

Assistant:

int Abc_NodeCompareLevels( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = Abc_ObjLevel(*pp1) - Abc_ObjLevel(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    Diff = (*pp1)->Id - (*pp2)->Id; // needed to make qsort() platform-infependent
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}